

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2_cod.c
# Opt level: O0

void jp2_cmap_dumpdata(jp2_box_t *box,FILE *out)

{
  ulong *puVar1;
  jp2_cmapent_t *ent;
  uint i;
  jp2_cmap_t *cmap;
  FILE *out_local;
  jp2_box_t *box_local;
  
  fprintf((FILE *)out,"numchans = %d\n",(box->data).ftyp.majver & 0xffffffff);
  for (ent._4_4_ = 0; (ulong)ent._4_4_ < (box->data).ftyp.majver; ent._4_4_ = ent._4_4_ + 1) {
    puVar1 = (ulong *)((box->data).bpcc.bpcs + (ulong)ent._4_4_ * 0x10);
    fprintf((FILE *)out,"cmptno=%d; map=%d; pcol=%d\n",*puVar1 & 0xffffffff,(ulong)(byte)puVar1[1],
            (ulong)*(byte *)((long)puVar1 + 9));
  }
  return;
}

Assistant:

static void jp2_cmap_dumpdata(jp2_box_t *box, FILE *out)
{
	jp2_cmap_t *cmap = &box->data.cmap;
	unsigned int i;
	jp2_cmapent_t *ent;
	fprintf(out, "numchans = %d\n", (int) cmap->numchans);
	for (i = 0; i < cmap->numchans; ++i) {
		ent = &cmap->ents[i];
		fprintf(out, "cmptno=%d; map=%d; pcol=%d\n",
		  (int) ent->cmptno, (int) ent->map, (int) ent->pcol);
	}
}